

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseEncodingSynapse.cpp
# Opt level: O0

void __thiscall TemporalPhaseEncodingSynapse::update(TemporalPhaseEncodingSynapse *this)

{
  Logging *this_00;
  Index IVar1;
  Scalar *pSVar2;
  value_type pEVar3;
  reference ppEVar4;
  long in_RDI;
  double dVar5;
  double dVar6;
  double bin;
  double vs;
  double scaledValue;
  int j_1;
  int j;
  int i;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  TemporalPhaseEncodingSynapse *in_stack_ffffffffffffff70;
  SpikeEvent *in_stack_ffffffffffffff80;
  int local_20;
  uint local_10;
  int local_c;
  
  local_c = 0;
  do {
    if (*(int *)(in_RDI + 0x30) <= local_c) {
      return;
    }
    resetOutput(in_stack_ffffffffffffff70);
    local_10 = 0;
    while( true ) {
      IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        (in_stack_ffffffffffffff60);
      if (IVar1 <= (int)local_10) break;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffff70,(Index)in_stack_ffffffffffffff68);
      dVar6 = *pSVar2;
      dVar5 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x50));
      if (dVar5 < dVar6) {
LAB_0016ea09:
        pEVar3 = (value_type)operator_new(0x18);
        NoEvent::NoEvent((NoEvent *)in_stack_ffffffffffffff80);
        ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),
                             (long)(int)local_10);
        *ppEVar4 = pEVar3;
      }
      else {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffff70,(Index)in_stack_ffffffffffffff68);
        if (*pSVar2 <= -1.0) goto LAB_0016ea09;
        pEVar3 = (value_type)operator_new(0x28);
        SpikeEvent::SpikeEvent(in_stack_ffffffffffffff80);
        ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),
                             (long)(int)local_10);
        *ppEVar4 = pEVar3;
        ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),
                             (long)(int)local_10);
        (**(*ppEVar4)->_vptr_Event)(0x4094500000000000);
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffff70,(Index)in_stack_ffffffffffffff68);
        *pSVar2 = -1.0;
      }
      in_stack_ffffffffffffff80 = *(SpikeEvent **)(in_RDI + 0x10);
      ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),
                           (long)(int)local_10);
      (*(in_stack_ffffffffffffff80->super_Event)._vptr_Event[5])
                (in_stack_ffffffffffffff80,(ulong)local_10,*ppEVar4);
      this_00 = *(Logging **)(in_RDI + 0x58);
      ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),
                           (long)(int)local_10);
      Logging::logEvent(this_00,in_RDI,local_10,(*ppEVar4)->type);
      local_10 = local_10 + 1;
    }
    dVar6 = *(double *)(in_RDI + 0x38);
    dVar5 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x50));
    if (dVar6 <= dVar5) {
      local_20 = 0;
      while( true ) {
        in_stack_ffffffffffffff70 = (TemporalPhaseEncodingSynapse *)(long)local_20;
        IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          (in_stack_ffffffffffffff60);
        if (IVar1 <= (long)in_stack_ffffffffffffff70) break;
        ppEVar4 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)
                             (*(long *)(in_RDI + 8) + 8),(long)local_20);
        dVar6 = round(((double)(*ppEVar4)[1]._vptr_Event * 0.8 + 0.1) *
                      *(double *)(*(long *)(in_RDI + 0x18) + 0x10) *
                      (double)**(int **)(in_RDI + 0x18));
        in_stack_ffffffffffffff60 =
             *(EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(in_RDI + 0x38);
        in_stack_ffffffffffffff68 =
             helperFunctions::clamp
                       (dVar6 / (double)**(int **)(in_RDI + 0x18) + *(double *)(in_RDI + 0x48),
                        *(double *)(*(long *)(in_RDI + 0x18) + 0x10) * 0.0,
                        *(double *)(*(long *)(in_RDI + 0x18) + 0x10) * 0.9);
        in_stack_ffffffffffffff68 = (double)in_stack_ffffffffffffff60 + in_stack_ffffffffffffff68;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffff70,(Index)in_stack_ffffffffffffff68);
        *pSVar2 = in_stack_ffffffffffffff68;
        local_20 = local_20 + 1;
      }
      *(double *)(in_RDI + 0x38) =
           *(double *)(*(long *)(in_RDI + 0x18) + 0x10) + *(double *)(in_RDI + 0x38);
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void TemporalPhaseEncodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        resetOutput();
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) <= clock->getCurrentTime() && spikeTimes(j) > -1) {
                output[j] = new SpikeEvent();
                output[j]->setWeight(1300.0);
                spikeTimes(j) = -1;
            }
            else {
                output[j] = new NoEvent();
            }
            to_population->setInput(j, output[j]);
            logger->logEvent((long)this, j, output[j]->type);
        }
        if(currentWindow <= clock->getCurrentTime()) {
            for(int j = 0; j < spikeTimes.size(); j++) {
                double scaledValue = 0.1 + static_cast<ValueEvent*>(from_population->output[j])->value * 0.8;
                double vs = scaledValue * param->window_length_s;
                double bin = round(vs * param->som_frequency);
                spikeTimes(j) = currentWindow + helperFunctions::clamp(bin / param->som_frequency + phaseOffset, 0*param->window_length_s, param->window_length_s*0.9);

                // double spikeTime = floor(static_cast<ValueEvent*>(from_population->output[j])->value * param->som_frequency) * phaseStep +param->som_phase;
                // spikeTimes(j) = currentWindow + helperFunctions::clamp((spikeTime * 0.8), 0, 0.9*param->window_length_s);
            }
            currentWindow += param->window_length_s;
        }
    }
}